

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

void __thiscall nuraft::asio_rpc_client::~asio_rpc_client(asio_rpc_client *this)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  asio_rpc_client *in_RDI;
  stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>
  *in_stack_ffffffffffffffc0;
  string local_28 [40];
  
  (in_RDI->super_rpc_client)._vptr_rpc_client = (_func_int **)&PTR__asio_rpc_client_006e1948;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->l_);
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x25e8e7);
    iVar2 = (*peVar3->_vptr_logger[7])();
    if (5 < iVar2) {
      in_stack_ffffffffffffffc0 =
           (stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&> *)
           std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x25e913);
      msg_if_given_abi_cxx11_((char *)local_28,"asio client destroyed: %p",in_RDI);
      (*(code *)(in_stack_ffffffffffffffc0->next_layer_->
                super_basic_socket<asio::ip::tcp,_asio::any_io_executor>).impl_.executor_.
                super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
                .super_any_executor_base.target_)
                (in_stack_ffffffffffffffc0,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                 ,"~asio_rpc_client",0x3a3,local_28);
      std::__cxx11::string::~string(local_28);
    }
  }
  close_socket(in_RDI);
  std::shared_ptr<nuraft::logger>::~shared_ptr((shared_ptr<nuraft::logger> *)0x25e987);
  asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  ::~basic_waitable_timer
            ((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
              *)0x25e998);
  std::__cxx11::string::~string((string *)&in_RDI->port_);
  std::__cxx11::string::~string((string *)&in_RDI->host_);
  asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>::~stream
            (in_stack_ffffffffffffffc0);
  asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>::~basic_stream_socket
            ((basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *)0x25e9d9);
  asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::~basic_resolver
            ((basic_resolver<asio::ip::tcp,_asio::any_io_executor> *)in_stack_ffffffffffffffc0);
  std::enable_shared_from_this<nuraft::asio_rpc_client>::~enable_shared_from_this
            ((enable_shared_from_this<nuraft::asio_rpc_client> *)0x25e9f5);
  rpc_client::~rpc_client(&in_RDI->super_rpc_client);
  return;
}

Assistant:

virtual ~asio_rpc_client() {
        p_tr("asio client destroyed: %p", this);
        close_socket();
    }